

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O1

int chrono::collision::ChGeometryCollider::ComputeSphereSphereCollisions
              (ChSphere *mgeo1,Vector *c1,ChSphere *mgeo2,Vector *c2,
              ChNarrowPhaseCollider *mcollider,bool just_intersection)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  ChVector<double> result_1;
  ChVector<double> result;
  ChCollisionPair temp;
  ChVector<float> local_e4;
  ChVector<double> local_d8;
  ChVector<double> local_b8;
  undefined1 local_98 [44];
  undefined4 uStack_6c;
  undefined1 auStack_68 [28];
  
  dVar3 = c2->m_data[0] - c1->m_data[0];
  dVar4 = c2->m_data[1] - c1->m_data[1];
  dVar5 = c2->m_data[2] - c1->m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4 * dVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar10 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar5;
  auVar10 = vfmadd231sd_fma(auVar10,auVar8,auVar8);
  if (auVar10._0_8_ < 0.0) {
    dVar12 = sqrt(auVar10._0_8_);
    auVar10._8_8_ = 0;
  }
  else {
    auVar8 = vsqrtsd_avx(auVar10,auVar10);
    dVar12 = auVar8._0_8_;
  }
  bVar6 = 2.2250738585072014e-308 <= dVar12;
  if (auVar10._0_8_ < 0.0) {
    dVar7 = sqrt(auVar10._0_8_);
  }
  else {
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar7 = auVar10._0_8_;
  }
  dVar1 = mgeo1->rad;
  dVar2 = mgeo2->rad;
  if (just_intersection) {
    if (dVar1 + dVar2 <= dVar7) {
      return 0;
    }
    ChCollisionPair::ChCollisionPair
              ((ChCollisionPair *)local_98,&mgeo1->super_ChGeometry,&mgeo2->super_ChGeometry);
  }
  else {
    if (dVar1 + dVar2 + 0.0022 <= dVar7) {
      return 0;
    }
    dVar12 = 1.0 / dVar12;
    dVar4 = (double)((ulong)bVar6 * (long)(dVar12 * dVar4));
    dVar7 = (double)((ulong)bVar6 * (long)(dVar12 * dVar3) + (ulong)!bVar6 * 0x3ff0000000000000);
    dVar3 = (double)((ulong)bVar6 * (long)(dVar12 * dVar5));
    local_b8.m_data[0] = dVar7 * dVar1 + c1->m_data[0];
    local_b8.m_data[1] = dVar4 * dVar1 + c1->m_data[1];
    local_b8.m_data[2] = dVar3 * dVar1 + c1->m_data[2];
    local_d8.m_data[0] = c2->m_data[0] - dVar7 * dVar2;
    local_d8.m_data[1] = c2->m_data[1] - dVar4 * dVar2;
    local_d8.m_data[2] = c2->m_data[2] - dVar3 * dVar2;
    local_e4.m_data[0] = (float)dVar7;
    local_e4.m_data[1] = (float)dVar4;
    local_e4.m_data[2] = (float)dVar3;
    auStack_68 = SUB3228(ZEXT832(0),0);
    local_98._16_28_ = auStack_68 << 0x20;
    uStack_6c = 0;
    ChCollisionPair::Set
              ((ChCollisionPair *)local_98,&mgeo1->super_ChGeometry,&mgeo2->super_ChGeometry,
               &local_b8,&local_d8,&local_e4,(float *)0x0);
  }
  ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)local_98);
  return 1;
}

Assistant:

int ChGeometryCollider::ComputeSphereSphereCollisions(
    geometry::ChSphere& mgeo1,         ///< first sphere
    Vector* c1,                        ///< absolute position of 1st
    geometry::ChSphere& mgeo2,         ///< second sphere
    Vector* c2,                        ///< absolute position of 2nd
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection) {
    Vector relPos = Vsub(*c2, *c1);
    Vector dir = Vnorm(relPos);
    double dist = Vlength(relPos);
    if (just_intersection) {
        if (dist < (mgeo1.rad + mgeo2.rad)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        if (dist < CH_COLL_ENVELOPE + (mgeo1.rad + mgeo2.rad)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2,                    // geometries
                                                   Vadd(*c1, Vmul(dir, mgeo1.rad)),   // p1
                                                   Vadd(*c2, Vmul(dir, -mgeo2.rad)),  // p2
                                                   dir);                              // normal
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    }

    return 0;
}